

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O3

void __kmp_dispatch_dxo<unsigned_int>(int *gtid_ref,int *cid_ref,ident_t *loc_ref)

{
  kmp_uint32 *pkVar1;
  kmp_info_t *pkVar2;
  dispatch_shared_info_t *pdVar3;
  dispatch_private_info_t *unaff_RBX;
  
  pkVar2 = __kmp_threads[*gtid_ref];
  if ((__kmp_env_consistency_check != 0) &&
     (unaff_RBX = ((pkVar2->th).th_dispatch)->th_dispatch_pr_current,
     unaff_RBX->pushed_ws != ct_none)) {
    __kmp_pop_sync(*gtid_ref,ct_ordered_in_pdo,loc_ref);
  }
  if ((((pkVar2->th).th_team)->t).t_serialized == 0) {
    if (__kmp_env_consistency_check == 0) {
      unaff_RBX = ((pkVar2->th).th_dispatch)->th_dispatch_pr_current;
    }
    pdVar3 = ((pkVar2->th).th_dispatch)->th_dispatch_sh_current;
    if (__kmp_itt_fsync_releasing_ptr__3_0 != (undefined1 *)0x0) {
      (*(code *)__kmp_itt_fsync_releasing_ptr__3_0)((undefined1 *)((long)&pdVar3->u + 8));
    }
    unaff_RBX->ordered_bumped = unaff_RBX->ordered_bumped + 1;
    LOCK();
    pkVar1 = &(pdVar3->u).s32.ordered_iteration;
    *pkVar1 = *pkVar1 + 1;
    UNLOCK();
  }
  return;
}

Assistant:

static void
__kmp_dispatch_dxo( int *gtid_ref, int *cid_ref, ident_t *loc_ref )
{
    typedef typename traits_t< UT >::signed_t    ST;
    dispatch_private_info_template< UT > * pr;

    int gtid = *gtid_ref;
//    int  cid = *cid_ref;
    kmp_info_t *th = __kmp_threads[ gtid ];
    KMP_DEBUG_ASSERT( th -> th.th_dispatch );

    KD_TRACE(100, ("__kmp_dispatch_dxo: T#%d called\n", gtid ) );
    if ( __kmp_env_consistency_check ) {
        pr = reinterpret_cast< dispatch_private_info_template< UT >* >
            ( th -> th.th_dispatch -> th_dispatch_pr_current );
        if ( pr -> pushed_ws != ct_none ) {
            __kmp_pop_sync( gtid, ct_ordered_in_pdo, loc_ref );
        }
    }

    if ( ! th -> th.th_team -> t.t_serialized ) {
        dispatch_shared_info_template< UT >  * sh = reinterpret_cast< dispatch_shared_info_template< UT >* >
            ( th -> th.th_dispatch -> th_dispatch_sh_current );

        if ( ! __kmp_env_consistency_check ) {
            pr = reinterpret_cast< dispatch_private_info_template< UT >* >
                ( th -> th.th_dispatch -> th_dispatch_pr_current );
        }

        KMP_FSYNC_RELEASING( & sh->u.s.ordered_iteration );
        #if ! defined( KMP_GOMP_COMPAT )
            if ( __kmp_env_consistency_check ) {
                if ( pr->ordered_bumped != 0 ) {
                    struct cons_header *p = __kmp_threads[ gtid ]->th.th_cons;
                    /* How to test it? - OM */
                    __kmp_error_construct2(
                        kmp_i18n_msg_CnsMultipleNesting,
                        ct_ordered_in_pdo, loc_ref,
                        & p->stack_data[ p->w_top ]
                    );
                }
            }
        #endif /* !defined(KMP_GOMP_COMPAT) */

        KMP_MB();       /* Flush all pending memory write invalidates.  */

        pr->ordered_bumped += 1;

        KD_TRACE(1000, ("__kmp_dispatch_dxo: T#%d bumping ordered ordered_bumped=%d\n",
                        gtid, pr->ordered_bumped ) );

        KMP_MB();       /* Flush all pending memory write invalidates.  */

        /* TODO use general release procedure? */
        test_then_inc< ST >( (volatile ST *) & sh->u.s.ordered_iteration );

        KMP_MB();       /* Flush all pending memory write invalidates.  */
    }
    KD_TRACE(100, ("__kmp_dispatch_dxo: T#%d returned\n", gtid ) );
}